

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall slang::ast::EvalContext::reportDiags(EvalContext *this,Diagnostics *diagSet)

{
  size_type sVar1;
  long lVar2;
  pointer __location;
  
  if ((diagSet->super_SmallVector<slang::Diagnostic,_2UL>).super_SmallVectorBase<slang::Diagnostic>.
      len != 0) {
    if (((this->astCtx).assertionInstance != (AssertionInstanceDetails *)0x0) &&
       (this->backtraceReported == false)) {
      ASTContext::addAssertionBacktrace
                (&this->astCtx,
                 (diagSet->super_SmallVector<slang::Diagnostic,_2UL>).
                 super_SmallVectorBase<slang::Diagnostic>.data_);
      this->backtraceReported = true;
    }
    Scope::addDiags((this->astCtx).scope.ptr,diagSet);
    sVar1 = (diagSet->super_SmallVector<slang::Diagnostic,_2UL>).
            super_SmallVectorBase<slang::Diagnostic>.len;
    if (sVar1 != 0) {
      __location = (diagSet->super_SmallVector<slang::Diagnostic,_2UL>).
                   super_SmallVectorBase<slang::Diagnostic>.data_;
      lVar2 = sVar1 * 0x70;
      do {
        std::ranges::__destroy_at_fn::operator()<slang::Diagnostic>
                  ((__destroy_at_fn *)&std::ranges::destroy_at,__location);
        __location = __location + 1;
        lVar2 = lVar2 + -0x70;
      } while (lVar2 != 0);
    }
    (diagSet->super_SmallVector<slang::Diagnostic,_2UL>).super_SmallVectorBase<slang::Diagnostic>.
    len = 0;
  }
  return;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return len == 0; }